

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.h
# Opt level: O2

void __thiscall Player::~Player(Player *this)

{
  this->_vptr_Player = (_func_int **)&PTR_nextRound_0010eb00;
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base
            (&(this->m_cards).super__Vector_base<Card,_std::allocator<Card>_>);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

Player(std::string name = "noName") : m_name(name) {}